

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     global_exscan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,int *param_3)

{
  int iVar1;
  ulong uVar2;
  reference piVar3;
  ulong local_c0;
  size_t i;
  int local_ac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_a8;
  T presum;
  int *local_88;
  int *local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int local_6c;
  undefined1 local_68 [4];
  T sum;
  comm nonzero_comm;
  size_t n;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> o;
  comm *comm_local;
  int *local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  nonzero_comm._24_8_ = end._M_current;
  n = (size_t)begin._M_current;
  o._M_current = param_3;
  local_18 = end._M_current;
  end_local._M_current = begin._M_current;
  uVar2 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (begin,end);
  comm::split((comm *)local_68,(comm *)o._M_current,(uint)(uVar2 != 0));
  if (uVar2 != 0) {
    local_78 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&end_local,uVar2 - 1);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_78);
    local_6c = *piVar3;
    local_80 = end_local._M_current;
    local_88 = local_18;
    local_exscan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
              (end_local._M_current,local_18);
    _Stack_a8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&end_local,uVar2 - 1);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&stack0xffffffffffffff58);
    local_6c = local_6c + *piVar3;
    iVar1 = exscan<int,std::plus<int>>(&local_6c);
    local_ac = iVar1;
    i = (size_t)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n,0
                          );
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    *piVar3 = iVar1;
    for (local_c0 = 1; local_c0 < uVar2; local_c0 = local_c0 + 1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
      iVar1 = std::plus<int>::operator()((plus<int> *)((long)&comm_local + 7),&local_ac,piVar3);
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
      *piVar3 = iVar1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
    }
  }
  comm::~comm((comm *)local_68);
  return;
}

Assistant:

inline void global_exscan_inplace(Iterator begin, Iterator end, Func func, const mxx::comm& comm = mxx::comm()) {
    Iterator o = begin;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        typedef typename std::iterator_traits<Iterator>::value_type T;
        T sum = *(begin+(n-1));
        // local inplace scan
        local_exscan_inplace(begin, end, func);
        sum += *(begin+(n-1));
        // mxx::exscan
        T presum = exscan(sum, func, nonzero_comm);
        *o++ = presum;
        // accumulate previous sum on all local elements
        for (size_t i = 1; i < n; ++i) {
            *o = func(presum, *o);
            ++o;
        }
    }
}